

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O1

Am_Text_Fragment * __thiscall
Am_Rich_Text_Data::Get_Fragment_At
          (Am_Rich_Text_Data *this,Am_Text_Index inIndex,Am_Text_Length *outRelIndex)

{
  Am_Text_Fragment *pAVar1;
  ulong uVar2;
  ulong uVar3;
  
  pAVar1 = this->mHeadFragment;
  if (pAVar1 != (Am_Text_Fragment *)0x0) {
    uVar2 = 0;
    do {
      uVar3 = pAVar1->mStrLen + uVar2;
      if (inIndex <= uVar3) {
        *outRelIndex = ~uVar2 + inIndex;
        return pAVar1;
      }
      pAVar1 = pAVar1->mNext;
      uVar2 = uVar3;
    } while (pAVar1 != (Am_Text_Fragment *)0x0);
  }
  return pAVar1;
}

Assistant:

Am_Text_Fragment *
Am_Rich_Text_Data::Get_Fragment_At(const Am_Text_Index inIndex,
                                   Am_Text_Length &outRelIndex) const
{
  Am_Text_Index endOfFrag = 0;
  Am_Text_Fragment *frag = mHeadFragment;

  while (frag != nullptr) {
    endOfFrag += frag->Length();
    if (inIndex <= endOfFrag) {
      // find the relative index
      outRelIndex = frag->Length() - endOfFrag + inIndex - 1;
      break;
    }
    frag = frag->Next();
  }
  return frag;
}